

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void loop_restoration_copy_planes(AV1LrStruct *loop_rest_ctxt,AV1_COMMON *cm,int num_planes)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  FilterFrameCtxt *lr_plane_ctxt;
  int plane;
  int local_18;
  
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    if (*(int *)(in_RSI + 0x5a20 + (long)local_18 * 0x40) != 0) {
      lVar1 = in_RDI + 8 + (long)local_18 * 0x38;
      (*loop_restoration_copy_planes::copy_funs[local_18])
                (*(YV12_BUFFER_CONFIG **)(in_RDI + 0xb8),*(YV12_BUFFER_CONFIG **)(in_RDI + 0xb0),0,
                 *(int *)(lVar1 + 0x10),0,*(int *)(lVar1 + 0x14));
    }
  }
  return;
}

Assistant:

static void loop_restoration_copy_planes(AV1LrStruct *loop_rest_ctxt,
                                         AV1_COMMON *cm, int num_planes) {
  typedef void (*copy_fun)(const YV12_BUFFER_CONFIG *src_ybc,
                           YV12_BUFFER_CONFIG *dst_ybc, int hstart, int hend,
                           int vstart, int vend);
  static const copy_fun copy_funs[3] = { aom_yv12_partial_coloc_copy_y,
                                         aom_yv12_partial_coloc_copy_u,
                                         aom_yv12_partial_coloc_copy_v };
  assert(num_planes <= 3);
  for (int plane = 0; plane < num_planes; ++plane) {
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;
    FilterFrameCtxt *lr_plane_ctxt = &loop_rest_ctxt->ctxt[plane];
    copy_funs[plane](loop_rest_ctxt->dst, loop_rest_ctxt->frame, 0,
                     lr_plane_ctxt->plane_w, 0, lr_plane_ctxt->plane_h);
  }
}